

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

Node * findRule(char *name,int defined)

{
  int iVar1;
  Node *pNVar2;
  char *local_30;
  char *ptr;
  Node *n;
  int defined_local;
  char *name_local;
  
  for (local_30 = name; *local_30 != '\0'; local_30 = local_30 + 1) {
    if (*local_30 == '-') {
      *local_30 = '_';
    }
  }
  ptr = (char *)&rules->type;
  while( true ) {
    if (ptr == (char *)0x0) {
      pNVar2 = makeRule(name,defined);
      return pNVar2;
    }
    if (*(int *)ptr != 1) break;
    iVar1 = strcmp(name,*(char **)(ptr + 0x18));
    if (iVar1 == 0) {
      return (Node *)ptr;
    }
    ptr = *(char **)(ptr + 8);
  }
  __assert_fail("Rule == n->type",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                ,0x4a,"Node *findRule(char *, int)");
}

Assistant:

Node *findRule(char *name, int defined)
{
  Node *n;
  char *ptr;
  for (ptr= name;  *ptr;  ptr++) if ('-' == *ptr) *ptr= '_';
  for (n= rules;  n;  n= n->any.next)
    {
      assert(Rule == n->type);
      if (!strcmp(name, n->rule.name))
	return n;
    }
  return makeRule(name, defined);
}